

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomSlots::write(DomSlots *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  QString *pQVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long lVar4;
  long in_FS_OFFSET;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QString local_50;
  long local_38;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_50.d.d = (Data *)0x0;
    local_50.d.ptr = L"slots";
    local_50.d.size = 5;
  }
  else {
    QString::toLower_helper(&local_50);
  }
  QVar5.m_size = (size_t)local_50.d.ptr;
  QVar5.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar5);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  lVar1 = (this->m_signal).d.size;
  if (lVar1 != 0) {
    pQVar2 = (this->m_signal).d.ptr;
    lVar4 = 0;
    do {
      QVar6.m_size = (size_t)L"signal";
      QVar6.field_0.m_data = aVar3.m_data;
      QVar8.m_size = *(size_t *)((long)&(pQVar2->d).ptr + lVar4);
      QVar8.field_0.m_data = (void *)0x8000000000000006;
      QXmlStreamWriter::writeTextElement(QVar6,QVar8);
      lVar4 = lVar4 + 0x18;
    } while (lVar1 * 0x18 != lVar4);
  }
  lVar1 = (this->m_slot).d.size;
  if (lVar1 != 0) {
    pQVar2 = (this->m_slot).d.ptr;
    lVar4 = 0;
    do {
      QVar7.m_size = (size_t)L"slot";
      QVar7.field_0.m_data = aVar3.m_data;
      QVar9.m_size = *(size_t *)((long)&(pQVar2->d).ptr + lVar4);
      QVar9.field_0.m_data = (void *)0x8000000000000004;
      QXmlStreamWriter::writeTextElement(QVar7,QVar9);
      lVar4 = lVar4 + 0x18;
    } while (lVar1 * 0x18 != lVar4);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomSlots::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("slots") : tagName.toLower());

    for (const QString &v : m_signal)
        writer.writeTextElement(u"signal"_s, v);

    for (const QString &v : m_slot)
        writer.writeTextElement(u"slot"_s, v);

    writer.writeEndElement();
}